

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::SetupWriteAutogenInfo(cmQtAutoGenInitializer *this)

{
  pointer pcVar1;
  pointer pcVar2;
  size_type sVar3;
  MUFile *pMVar4;
  cmGeneratorTarget *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  cmQtAutoGenInitializer *pcVar8;
  char cVar9;
  cmMakefile *this_00;
  string *psVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  pointer ppMVar14;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  *__range2;
  char *pcVar15;
  char cVar16;
  uint uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  __normal_iterator<const_cmQtAutoGenInitializer::MUFile_**,_std::vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>_>
  __i;
  long lVar19;
  pointer filePath;
  _Hash_node_base *p_Var20;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar21;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  sortedHeaders;
  string err;
  string path;
  string __str;
  string basePath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourcesFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headersFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headersBuildPaths;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_skip;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_skip;
  InfoWriter ofs;
  undefined1 local_528 [32];
  float local_508;
  size_t local_500;
  __node_base_ptr p_Stack_4f8;
  cmQtAutoGenInitializer *local_4f0;
  uint local_4e4;
  cmFilePathChecksum local_4e0;
  string local_3e0;
  long *local_3c0;
  uint local_3b8;
  long local_3b0 [2];
  string local_3a0;
  cmMakefile *local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  string *local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined1 local_278 [584];
  
  InfoWriter::InfoWriter((InfoWriter *)local_278,&(this->AutogenTarget).InfoFile);
  uVar17 = *(uint *)(*(_func_int **)(local_278._0_8_ + -0x18) + (long)(local_278 + 0x20));
  if ((uVar17 & 5) == 0) {
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"# Meta\n",7);
    pcVar15 = "FALSE";
    if ((ulong)this->MultiConfig != 0) {
      pcVar15 = "TRUE";
    }
    local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p =
         (pointer)&local_4e0.parentDirs._M_elems[0].first.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4e0,pcVar15,pcVar15 + ((ulong)this->MultiConfig ^ 5));
    InfoWriter::Write((InfoWriter *)local_278,"AM_MULTI_CONFIG",(string *)&local_4e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
        &local_4e0.parentDirs._M_elems[0].first.field_2) {
      operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                      CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2._M_allocated_capacity.
                               _1_7_,local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0])
                      + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_PARALLEL",&(this->AutogenTarget).Parallel);
    InfoWriter::Write((InfoWriter *)local_278,"AM_VERBOSITY",&this->Verbosity);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"# Directories\n",0xe);
    local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p =
         (pointer)&local_4e0.parentDirs._M_elems[0].first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"CMAKE_SOURCE_DIR","");
    psVar10 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_4e0);
    pcVar1 = local_528 + 0x10;
    pcVar2 = (psVar10->_M_dataplus)._M_p;
    local_528._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_528,pcVar2,pcVar2 + psVar10->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
        &local_4e0.parentDirs._M_elems[0].first.field_2) {
      operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                      CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2._M_allocated_capacity.
                               _1_7_,local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0])
                      + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_SOURCE_DIR",(string *)local_528);
    if ((pointer)local_528._0_8_ != pcVar1) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
    local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p =
         (pointer)&local_4e0.parentDirs._M_elems[0].first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"CMAKE_BINARY_DIR","");
    psVar10 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_4e0);
    pcVar2 = (psVar10->_M_dataplus)._M_p;
    local_528._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_528,pcVar2,pcVar2 + psVar10->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
        &local_4e0.parentDirs._M_elems[0].first.field_2) {
      operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                      CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2._M_allocated_capacity.
                               _1_7_,local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0])
                      + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_BINARY_DIR",(string *)local_528);
    if ((pointer)local_528._0_8_ != pcVar1) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
    local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p =
         (pointer)&local_4e0.parentDirs._M_elems[0].first.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4e0,"CMAKE_CURRENT_SOURCE_DIR","");
    psVar10 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_4e0);
    pcVar2 = (psVar10->_M_dataplus)._M_p;
    local_528._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_528,pcVar2,pcVar2 + psVar10->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
        &local_4e0.parentDirs._M_elems[0].first.field_2) {
      operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                      CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2._M_allocated_capacity.
                               _1_7_,local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0])
                      + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_CURRENT_SOURCE_DIR",(string *)local_528);
    if ((pointer)local_528._0_8_ != pcVar1) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
    local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p =
         (pointer)&local_4e0.parentDirs._M_elems[0].first.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4e0,"CMAKE_CURRENT_BINARY_DIR","");
    psVar10 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_4e0);
    pcVar2 = (psVar10->_M_dataplus)._M_p;
    local_528._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_528,pcVar2,pcVar2 + psVar10->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
        &local_4e0.parentDirs._M_elems[0].first.field_2) {
      operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                      CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2._M_allocated_capacity.
                               _1_7_,local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0])
                      + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_CURRENT_BINARY_DIR",(string *)local_528);
    if ((pointer)local_528._0_8_ != pcVar1) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
    local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p =
         (pointer)&local_4e0.parentDirs._M_elems[0].first.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4e0,"CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE","");
    psVar10 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_4e0);
    pcVar2 = (psVar10->_M_dataplus)._M_p;
    local_528._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_528,pcVar2,pcVar2 + psVar10->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
        &local_4e0.parentDirs._M_elems[0].first.field_2) {
      operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                      CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2._M_allocated_capacity.
                               _1_7_,local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0])
                      + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
                      (string *)local_528);
    if ((pointer)local_528._0_8_ != pcVar1) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
    }
    InfoWriter::Write((InfoWriter *)local_278,"AM_BUILD_DIR",&(this->Dir).Build);
    InfoWriter::Write((InfoWriter *)local_278,"AM_INCLUDE_DIR",&(this->Dir).Include);
    InfoWriter::WriteConfig((InfoWriter *)local_278,"AM_INCLUDE_DIR",&(this->Dir).ConfigInclude);
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_338.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_338.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_338.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_358.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_358.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_358.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_378.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2a8._M_impl.super__Rb_tree_header._M_header;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_2d8._M_impl.super__Rb_tree_header._M_header;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    sVar3 = (this->AutogenTarget).Headers._M_h._M_element_count;
    local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_318,sVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_338,sVar3);
    local_528._0_8_ = (pointer)0x0;
    local_528._8_8_ = (pointer)0x0;
    local_528._16_8_ = 0;
    local_380 = this_00;
    std::
    vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::reserve((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               *)local_528,sVar3);
    p_Var20 = (this->AutogenTarget).Headers._M_h._M_before_begin._M_nxt;
    local_4f0 = this;
    if (p_Var20 != (_Hash_node_base *)0x0) {
      do {
        local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p = (pointer)p_Var20[2]._M_nxt;
        std::
        vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
        ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                  ((vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
                    *)local_528,(MUFile **)&local_4e0);
        p_Var20 = p_Var20->_M_nxt;
      } while (p_Var20 != (_Hash_node_base *)0x0);
    }
    uVar7 = local_528._8_8_;
    uVar6 = local_528._0_8_;
    if (local_528._0_8_ != local_528._8_8_) {
      lVar19 = local_528._8_8_ - local_528._0_8_;
      uVar11 = lVar19 >> 3;
      lVar13 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                (local_528._0_8_,local_528._8_8_,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar19 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                  (uVar6,uVar7);
      }
      else {
        ppMVar14 = (pointer)(uVar6 + 0x80);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                  (uVar6,ppMVar14);
        for (; ppMVar14 != (pointer)uVar7; ppMVar14 = ppMVar14 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                    (ppMVar14);
        }
      }
    }
    uVar6 = local_528._8_8_;
    local_4e4 = uVar17;
    if (local_528._0_8_ != local_528._8_8_) {
      ppMVar14 = (pointer)local_528._0_8_;
      do {
        pMVar4 = *ppMVar14;
        if ((pMVar4->Generated != true) || (local_4f0->CMP0071Accept == true)) {
          if (pMVar4->SkipMoc == true) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_2a8,&pMVar4->RealPath);
          }
          if (pMVar4->SkipUic == true) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_2d8,&pMVar4->RealPath);
          }
          if ((pMVar4->MocIt != false) || (pMVar4->UicIt == true)) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_318,&pMVar4->RealPath);
            local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p =
                 (pointer)&local_4e0.parentDirs._M_elems[0].first.field_2;
            local_4e0.parentDirs._M_elems[0].first._M_string_length = 0;
            local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0] = '\0';
            cVar16 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_4e0;
            std::__cxx11::string::push_back(cVar16);
            std::__cxx11::string::push_back(cVar16);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_4e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
                &local_4e0.parentDirs._M_elems[0].first.field_2) {
              operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                              CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2.
                                       _M_allocated_capacity._1_7_,
                                       local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf
                                       [0]) + 1);
            }
          }
        }
        ppMVar14 = ppMVar14 + 1;
      } while (ppMVar14 != (pointer)uVar6);
    }
    if ((pointer)local_528._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ - local_528._0_8_);
    }
    cmFilePathChecksum::cmFilePathChecksum(&local_4e0,local_380);
    local_528._0_8_ = &p_Stack_4f8;
    local_528._8_8_ = (pointer)0x1;
    local_528._16_8_ = 0;
    local_528._24_8_ = 0;
    local_508 = 1.0;
    local_500 = 0;
    p_Stack_4f8 = (__node_base_ptr)0x0;
    local_2e0 = local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar18 = &local_3e0.field_2;
      filePath = local_318.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmFilePathChecksum::getPart(&local_3a0,&local_4e0,filePath,10);
        std::__cxx11::string::append((char *)&local_3a0);
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_3e0,filePath);
        std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_3e0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0._M_dataplus._M_p != paVar18) {
          operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
        }
        uVar17 = 1;
        do {
          local_3e0._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3e0,local_3a0._M_dataplus._M_p,
                     local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
          if (1 < uVar17) {
            std::__cxx11::string::push_back((char)&local_3e0);
            cVar16 = '\x01';
            if (9 < uVar17) {
              uVar11 = (ulong)uVar17;
              cVar9 = '\x04';
              do {
                cVar16 = cVar9;
                uVar12 = (uint)uVar11;
                if (uVar12 < 100) {
                  cVar16 = cVar16 + -2;
                  goto LAB_001eadeb;
                }
                if (uVar12 < 1000) {
                  cVar16 = cVar16 + -1;
                  goto LAB_001eadeb;
                }
                if (uVar12 < 10000) goto LAB_001eadeb;
                uVar11 = uVar11 / 10000;
                cVar9 = cVar16 + '\x04';
              } while (99999 < uVar12);
              cVar16 = cVar16 + '\x01';
            }
LAB_001eadeb:
            local_3c0 = local_3b0;
            std::__cxx11::string::_M_construct((ulong)&local_3c0,cVar16);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_3c0,local_3b8,uVar17);
            std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_3c0);
            if (local_3c0 != local_3b0) {
              operator_delete(local_3c0,local_3b0[0] + 1);
            }
          }
          std::__cxx11::string::append((char *)&local_3e0);
          pVar21 = std::
                   _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::_M_emplace<std::__cxx11::string&>
                             ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)local_528,&local_3e0);
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_2f8,&local_3e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._M_dataplus._M_p != paVar18) {
              operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1
                             );
            }
            break;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != paVar18) {
            operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != 0x400);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        filePath = filePath + 1;
      } while (filePath != local_2e0);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_528);
    lVar13 = -0x100;
    paVar18 = &local_4e0.parentDirs._M_elems[3].second.field_2;
    do {
      if (paVar18 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar18->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                        paVar18->_M_allocated_capacity + 1);
      }
      if (&paVar18->_M_allocated_capacity + -4 != (size_type *)(&paVar18->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar18->_M_allocated_capacity)[-6],
                        (&paVar18->_M_allocated_capacity)[-4] + 1);
      }
      pcVar8 = local_4f0;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar18->_M_allocated_capacity + -8);
      lVar13 = lVar13 + 0x40;
    } while (lVar13 != 0);
    sVar3 = (local_4f0->AutogenTarget).Sources._M_h._M_element_count;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_358,sVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_378,sVar3);
    local_528._0_8_ = (pointer)0x0;
    local_528._8_8_ = (pointer)0x0;
    local_528._16_8_ = 0;
    std::
    vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::reserve((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               *)local_528,sVar3);
    p_Var20 = (pcVar8->AutogenTarget).Sources._M_h._M_before_begin._M_nxt;
    if (p_Var20 != (_Hash_node_base *)0x0) {
      do {
        local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p = (pointer)p_Var20[2]._M_nxt;
        std::
        vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
        ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                  ((vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
                    *)local_528,(MUFile **)&local_4e0);
        p_Var20 = p_Var20->_M_nxt;
      } while (p_Var20 != (_Hash_node_base *)0x0);
    }
    uVar7 = local_528._8_8_;
    uVar6 = local_528._0_8_;
    if (local_528._0_8_ != local_528._8_8_) {
      lVar19 = local_528._8_8_ - local_528._0_8_;
      uVar11 = lVar19 >> 3;
      lVar13 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                (local_528._0_8_,local_528._8_8_,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar19 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                  (uVar6,uVar7);
      }
      else {
        ppMVar14 = (pointer)(uVar6 + 0x80);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                  (uVar6,ppMVar14);
        for (; ppMVar14 != (pointer)uVar7; ppMVar14 = ppMVar14 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                    (ppMVar14);
        }
      }
    }
    uVar6 = local_528._8_8_;
    if (local_528._0_8_ != local_528._8_8_) {
      ppMVar14 = (pointer)local_528._0_8_;
      do {
        pMVar4 = *ppMVar14;
        if ((pMVar4->Generated != true) || (local_4f0->CMP0071Accept == true)) {
          if (pMVar4->SkipMoc == true) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_2a8,&pMVar4->RealPath);
          }
          if (pMVar4->SkipUic == true) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_2d8,&pMVar4->RealPath);
          }
          if ((pMVar4->MocIt != false) || (pMVar4->UicIt == true)) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_358,&pMVar4->RealPath);
            local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p =
                 (pointer)&local_4e0.parentDirs._M_elems[0].first.field_2;
            local_4e0.parentDirs._M_elems[0].first._M_string_length = 0;
            local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0] = '\0';
            cVar16 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_4e0;
            std::__cxx11::string::push_back(cVar16);
            std::__cxx11::string::push_back(cVar16);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_4e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
                &local_4e0.parentDirs._M_elems[0].first.field_2) {
              operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                              CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2.
                                       _M_allocated_capacity._1_7_,
                                       local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf
                                       [0]) + 1);
            }
          }
        }
        ppMVar14 = ppMVar14 + 1;
      } while (ppMVar14 != (pointer)uVar6);
    }
    if ((pointer)local_528._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_528._0_8_,local_528._16_8_ - local_528._0_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"# Qt\n",5);
    uVar17 = local_4e4;
    pcVar8 = local_4f0;
    pcVar1 = local_528 + 0x10;
    InfoWriter::WriteUInt
              ((InfoWriter *)local_278,"AM_QT_VERSION_MAJOR",(local_4f0->QtVersion).Major);
    InfoWriter::Write((InfoWriter *)local_278,"AM_QT_MOC_EXECUTABLE",
                      &(pcVar8->Moc).super_GenVarsT.Executable);
    InfoWriter::Write((InfoWriter *)local_278,"AM_QT_UIC_EXECUTABLE",
                      &(pcVar8->Uic).super_GenVarsT.Executable);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"# Files\n",8);
    psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    InfoWriter::Write((InfoWriter *)local_278,"AM_CMAKE_EXECUTABLE",psVar10);
    InfoWriter::Write((InfoWriter *)local_278,"AM_SETTINGS_FILE",
                      &(pcVar8->AutogenTarget).SettingsFile);
    InfoWriter::WriteConfig
              ((InfoWriter *)local_278,"AM_SETTINGS_FILE",
               &(pcVar8->AutogenTarget).ConfigSettingsFile);
    InfoWriter::Write((InfoWriter *)local_278,"AM_PARSE_CACHE_FILE",
                      &(pcVar8->AutogenTarget).ParseCacheFile);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_HEADERS",&local_318);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_HEADERS_FLAGS",&local_338);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_HEADERS_BUILD_PATHS",&local_2f8);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_SOURCES",&local_358);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_278,"AM_SOURCES_FLAGS",&local_378);
    if ((pcVar8->Moc).super_GenVarsT.Enabled == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"# MOC settings\n",0xf);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_SKIP",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2a8);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_DEFINITIONS",&(pcVar8->Moc).Defines);
      InfoWriter::
      WriteConfigStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_DEFINITIONS",&(pcVar8->Moc).ConfigDefines);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_INCLUDES",&(pcVar8->Moc).Includes);
      InfoWriter::
      WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_MOC_INCLUDES",&(pcVar8->Moc).ConfigIncludes);
      pcVar5 = pcVar8->Target;
      local_528._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"AUTOMOC_MOC_OPTIONS","");
      pcVar15 = cmGeneratorTarget::GetSafeProperty(pcVar5,(string *)local_528);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e0,pcVar15,(allocator<char> *)&local_3a0);
      InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_OPTIONS",(string *)&local_4e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
          &local_4e0.parentDirs._M_elems[0].first.field_2) {
        operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                        CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0]) + 1
                       );
      }
      if ((pointer)local_528._0_8_ != pcVar1) {
        operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
      }
      local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p =
           (pointer)&local_4e0.parentDirs._M_elems[0].first.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4e0,"CMAKE_AUTOMOC_RELAXED_MODE","");
      psVar10 = cmMakefile::GetSafeDefinition(local_380,(string *)&local_4e0);
      pcVar2 = (psVar10->_M_dataplus)._M_p;
      local_528._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_528,pcVar2,pcVar2 + psVar10->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
          &local_4e0.parentDirs._M_elems[0].first.field_2) {
        operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                        CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0]) + 1
                       );
      }
      InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_RELAXED_MODE",(string *)local_528);
      if ((pointer)local_528._0_8_ != pcVar1) {
        operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
      }
      pcVar5 = pcVar8->Target;
      local_528._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"AUTOMOC_MACRO_NAMES","");
      pcVar15 = cmGeneratorTarget::GetSafeProperty(pcVar5,(string *)local_528);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e0,pcVar15,(allocator<char> *)&local_3a0);
      InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_MACRO_NAMES",(string *)&local_4e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
          &local_4e0.parentDirs._M_elems[0].first.field_2) {
        operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                        CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0]) + 1
                       );
      }
      if ((pointer)local_528._0_8_ != pcVar1) {
        operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
      }
      pcVar5 = pcVar8->Target;
      local_528._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_528,"AUTOMOC_DEPEND_FILTERS","");
      pcVar15 = cmGeneratorTarget::GetSafeProperty(pcVar5,(string *)local_528);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e0,pcVar15,(allocator<char> *)&local_3a0);
      InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_DEPEND_FILTERS",(string *)&local_4e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p !=
          &local_4e0.parentDirs._M_elems[0].first.field_2) {
        operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                        CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0]) + 1
                       );
      }
      if ((pointer)local_528._0_8_ != pcVar1) {
        operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
      }
      InfoWriter::Write((InfoWriter *)local_278,"AM_MOC_PREDEFS_CMD",&(pcVar8->Moc).PredefsCmd);
    }
    if ((pcVar8->Uic).super_GenVarsT.Enabled == true) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_2d8,
                 (pcVar8->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )&(pcVar8->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"# UIC settings\n",0xf);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_SKIP",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2d8);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_TARGET_OPTIONS",&(pcVar8->Uic).Options);
      InfoWriter::
      WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_TARGET_OPTIONS",&(pcVar8->Uic).ConfigOptions);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_OPTIONS_FILES",&(pcVar8->Uic).FileFiles);
      InfoWriter::WriteNestedLists
                ((InfoWriter *)local_278,"AM_UIC_OPTIONS_OPTIONS",&(pcVar8->Uic).FileOptions);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_278,"AM_UIC_SEARCH_PATHS",&(pcVar8->Uic).SearchPaths);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_378);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_358);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_338);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_318);
  }
  else {
    paVar18 = &local_4e0.parentDirs._M_elems[0].first.field_2;
    local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4e0,"AutoGen: Could not write file ","");
    std::__cxx11::string::_M_append
              ((char *)&local_4e0,(ulong)(this->AutogenTarget).InfoFile._M_dataplus._M_p);
    cmSystemTools::Error((string *)&local_4e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p != paVar18) {
      operator_delete(local_4e0.parentDirs._M_elems[0].first._M_dataplus._M_p,
                      CONCAT71(local_4e0.parentDirs._M_elems[0].first.field_2._M_allocated_capacity.
                               _1_7_,local_4e0.parentDirs._M_elems[0].first.field_2._M_local_buf[0])
                      + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return (uVar17 & 5) == 0;
}

Assistant:

bool cmQtAutoGenInitializer::SetupWriteAutogenInfo()
{
  InfoWriter ofs(this->AutogenTarget.InfoFile);
  if (ofs) {
    // Utility lambdas
    cmMakefile* makefile = this->Target->Target->GetMakefile();
    auto MfDef = [makefile](const char* key) {
      return makefile->GetSafeDefinition(key);
    };

    // Write common settings
    ofs.Write("# Meta\n");
    ofs.Write("AM_MULTI_CONFIG", this->MultiConfig ? "TRUE" : "FALSE");
    ofs.Write("AM_PARALLEL", this->AutogenTarget.Parallel);
    ofs.Write("AM_VERBOSITY", this->Verbosity);

    ofs.Write("# Directories\n");
    ofs.Write("AM_CMAKE_SOURCE_DIR", MfDef("CMAKE_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_BINARY_DIR", MfDef("CMAKE_BINARY_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_SOURCE_DIR",
              MfDef("CMAKE_CURRENT_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_BINARY_DIR",
              MfDef("CMAKE_CURRENT_BINARY_DIR"));
    ofs.Write("AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
              MfDef("CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE"));
    ofs.Write("AM_BUILD_DIR", this->Dir.Build);
    ofs.Write("AM_INCLUDE_DIR", this->Dir.Include);
    ofs.WriteConfig("AM_INCLUDE_DIR", this->Dir.ConfigInclude);

    std::vector<std::string> headers;
    std::vector<std::string> headersFlags;
    std::vector<std::string> headersBuildPaths;
    std::vector<std::string> sources;
    std::vector<std::string> sourcesFlags;
    std::set<std::string> moc_skip;
    std::set<std::string> uic_skip;

    // Filter headers
    {
      auto headerCount = this->AutogenTarget.Headers.size();
      headers.reserve(headerCount);
      headersFlags.reserve(headerCount);

      std::vector<MUFile const*> sortedHeaders;
      {
        sortedHeaders.reserve(headerCount);
        for (auto const& pair : this->AutogenTarget.Headers) {
          sortedHeaders.emplace_back(pair.second.get());
        }
        std::sort(sortedHeaders.begin(), sortedHeaders.end(),
                  [](MUFile const* a, MUFile const* b) {
                    return (a->RealPath < b->RealPath);
                  });
      }

      for (MUFile const* const muf : sortedHeaders) {
        if (muf->Generated && !this->CMP0071Accept) {
          continue;
        }
        if (muf->SkipMoc) {
          moc_skip.insert(muf->RealPath);
        }
        if (muf->SkipUic) {
          uic_skip.insert(muf->RealPath);
        }
        if (muf->MocIt || muf->UicIt) {
          headers.emplace_back(muf->RealPath);
          std::string flags;
          flags += muf->MocIt ? 'M' : 'm';
          flags += muf->UicIt ? 'U' : 'u';
          headersFlags.emplace_back(std::move(flags));
        }
      }
    }
    // Header build paths
    {
      cmFilePathChecksum const fpathCheckSum(makefile);
      std::unordered_set<std::string> emitted;
      for (std::string const& hdr : headers) {
        std::string basePath = fpathCheckSum.getPart(hdr);
        basePath += "/moc_";
        basePath += cmSystemTools::GetFilenameWithoutLastExtension(hdr);
        for (unsigned int ii = 1; ii != 1024; ++ii) {
          std::string path = basePath;
          if (ii > 1) {
            path += '_';
            path += std::to_string(ii);
          }
          path += ".cpp";
          if (emitted.emplace(path).second) {
            headersBuildPaths.emplace_back(std::move(path));
            break;
          }
        }
      }
    }

    // Filter sources
    {
      auto sourcesCount = this->AutogenTarget.Sources.size();
      sources.reserve(sourcesCount);
      sourcesFlags.reserve(sourcesCount);

      std::vector<MUFile const*> sorted;
      sorted.reserve(sourcesCount);
      for (auto const& pair : this->AutogenTarget.Sources) {
        sorted.emplace_back(pair.second.get());
      }
      std::sort(sorted.begin(), sorted.end(),
                [](MUFile const* a, MUFile const* b) {
                  return (a->RealPath < b->RealPath);
                });

      for (MUFile const* const muf : sorted) {
        if (muf->Generated && !this->CMP0071Accept) {
          continue;
        }
        if (muf->SkipMoc) {
          moc_skip.insert(muf->RealPath);
        }
        if (muf->SkipUic) {
          uic_skip.insert(muf->RealPath);
        }
        if (muf->MocIt || muf->UicIt) {
          sources.emplace_back(muf->RealPath);
          std::string flags;
          flags += muf->MocIt ? 'M' : 'm';
          flags += muf->UicIt ? 'U' : 'u';
          sourcesFlags.emplace_back(std::move(flags));
        }
      }
    }

    ofs.Write("# Qt\n");
    ofs.WriteUInt("AM_QT_VERSION_MAJOR", this->QtVersion.Major);
    ofs.Write("AM_QT_MOC_EXECUTABLE", this->Moc.Executable);
    ofs.Write("AM_QT_UIC_EXECUTABLE", this->Uic.Executable);

    ofs.Write("# Files\n");
    ofs.Write("AM_CMAKE_EXECUTABLE", cmSystemTools::GetCMakeCommand());
    ofs.Write("AM_SETTINGS_FILE", this->AutogenTarget.SettingsFile);
    ofs.WriteConfig("AM_SETTINGS_FILE",
                    this->AutogenTarget.ConfigSettingsFile);
    ofs.Write("AM_PARSE_CACHE_FILE", this->AutogenTarget.ParseCacheFile);
    ofs.WriteStrings("AM_HEADERS", headers);
    ofs.WriteStrings("AM_HEADERS_FLAGS", headersFlags);
    ofs.WriteStrings("AM_HEADERS_BUILD_PATHS", headersBuildPaths);
    ofs.WriteStrings("AM_SOURCES", sources);
    ofs.WriteStrings("AM_SOURCES_FLAGS", sourcesFlags);

    // Write moc settings
    if (this->Moc.Enabled) {
      ofs.Write("# MOC settings\n");
      ofs.WriteStrings("AM_MOC_SKIP", moc_skip);
      ofs.WriteStrings("AM_MOC_DEFINITIONS", this->Moc.Defines);
      ofs.WriteConfigStrings("AM_MOC_DEFINITIONS", this->Moc.ConfigDefines);
      ofs.WriteStrings("AM_MOC_INCLUDES", this->Moc.Includes);
      ofs.WriteConfigStrings("AM_MOC_INCLUDES", this->Moc.ConfigIncludes);
      ofs.Write("AM_MOC_OPTIONS",
                this->Target->GetSafeProperty("AUTOMOC_MOC_OPTIONS"));
      ofs.Write("AM_MOC_RELAXED_MODE", MfDef("CMAKE_AUTOMOC_RELAXED_MODE"));
      ofs.Write("AM_MOC_MACRO_NAMES",
                this->Target->GetSafeProperty("AUTOMOC_MACRO_NAMES"));
      ofs.Write("AM_MOC_DEPEND_FILTERS",
                this->Target->GetSafeProperty("AUTOMOC_DEPEND_FILTERS"));
      ofs.Write("AM_MOC_PREDEFS_CMD", this->Moc.PredefsCmd);
    }

    // Write uic settings
    if (this->Uic.Enabled) {
      // Add skipped .ui files
      uic_skip.insert(this->Uic.SkipUi.begin(), this->Uic.SkipUi.end());

      ofs.Write("# UIC settings\n");
      ofs.WriteStrings("AM_UIC_SKIP", uic_skip);
      ofs.WriteStrings("AM_UIC_TARGET_OPTIONS", this->Uic.Options);
      ofs.WriteConfigStrings("AM_UIC_TARGET_OPTIONS", this->Uic.ConfigOptions);
      ofs.WriteStrings("AM_UIC_OPTIONS_FILES", this->Uic.FileFiles);
      ofs.WriteNestedLists("AM_UIC_OPTIONS_OPTIONS", this->Uic.FileOptions);
      ofs.WriteStrings("AM_UIC_SEARCH_PATHS", this->Uic.SearchPaths);
    }
  } else {
    std::string err = "AutoGen: Could not write file ";
    err += this->AutogenTarget.InfoFile;
    cmSystemTools::Error(err);
    return false;
  }

  return true;
}